

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<float,_3,_4> *
tcu::operator*(Matrix<float,_3,_4> *__return_storage_ptr__,Matrix<float,_3,_2> *a,
              Matrix<float,_2,_4> *b)

{
  int row_1;
  long lVar1;
  Matrix<float,_3,_4> *res;
  float *pfVar2;
  int row;
  long lVar3;
  Vector<float,_2> *pVVar4;
  long lVar5;
  Vector<float,_3> *pVVar6;
  int ndx;
  float v;
  float fVar7;
  undefined4 uVar8;
  
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[2].m_data + 2) = 0;
  pVVar6 = (__return_storage_ptr__->m_data).m_data;
  pVVar6[3].m_data[1] = 0.0;
  pVVar6[3].m_data[2] = 0.0;
  pVVar6 = (__return_storage_ptr__->m_data).m_data;
  pVVar6[1].m_data[1] = 0.0;
  pVVar6[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  lVar1 = 0;
  lVar3 = 0;
  pfVar2 = (float *)__return_storage_ptr__;
  do {
    lVar5 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar1 != lVar5) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar5) = uVar8;
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x30);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
    lVar1 = lVar1 + 0xc;
  } while (lVar3 != 3);
  lVar1 = 0;
  do {
    lVar3 = 0;
    pVVar4 = (Vector<float,_2> *)b;
    do {
      fVar7 = 0.0;
      lVar5 = 0;
      pVVar6 = (Vector<float,_3> *)a;
      do {
        fVar7 = fVar7 + ((Vector<tcu::Vector<float,_3>,_2> *)pVVar6->m_data)->m_data[0].m_data[0] *
                        ((Vector<tcu::Vector<float,_2>,_4> *)pVVar4->m_data)->m_data[0].m_data
                        [lVar5];
        lVar5 = lVar5 + 1;
        pVVar6 = pVVar6 + 1;
      } while (lVar5 == 1);
      (__return_storage_ptr__->m_data).m_data[lVar3].m_data[lVar1] = fVar7;
      lVar3 = lVar3 + 1;
      pVVar4 = pVVar4 + 1;
    } while (lVar3 != 4);
    lVar1 = lVar1 + 1;
    a = (Matrix<float,_3,_2> *)(((Vector<float,_3> *)a)->m_data + 1);
  } while (lVar1 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}